

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O2

void MinorRoot(GCObjectVisitor *v)

{
  _Elt_pointer ppTVar1;
  _Elt_pointer ppCVar2;
  _Elt_pointer ppSVar3;
  _Elt_pointer ppTVar4;
  _Elt_pointer ppCVar5;
  _Elt_pointer ppSVar6;
  _Elt_pointer ppTVar7;
  _Elt_pointer ppCVar8;
  _Elt_pointer ppSVar9;
  _Map_pointer pppTVar10;
  _Map_pointer pppCVar11;
  _Map_pointer pppSVar12;
  
  ppTVar1 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  ppTVar4 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppTVar7 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pppTVar10 = g_scopeTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
  while (ppCVar2 = g_scopeClosure.
                   super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur,
        ppCVar5 = g_scopeClosure.
                  super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last,
        ppCVar8 = g_scopeClosure.
                  super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur,
        pppCVar11 = g_scopeClosure.
                    super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node, ppTVar7 != ppTVar1) {
    (*((*ppTVar7)->super_GCObject)._vptr_GCObject[2])(*ppTVar7,v);
    ppTVar7 = ppTVar7 + 1;
    if (ppTVar7 == ppTVar4) {
      ppTVar7 = pppTVar10[1];
      pppTVar10 = pppTVar10 + 1;
      ppTVar4 = ppTVar7 + 0x40;
    }
  }
  while (ppSVar3 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur,
        ppSVar6 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_last,
        ppSVar9 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur,
        pppSVar12 = g_scopeString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node, ppCVar8 != ppCVar2) {
    (*((*ppCVar8)->super_GCObject)._vptr_GCObject[2])(*ppCVar8,v);
    ppCVar8 = ppCVar8 + 1;
    if (ppCVar8 == ppCVar5) {
      ppCVar5 = pppCVar11[1] + 0x40;
      ppCVar8 = pppCVar11[1];
      pppCVar11 = pppCVar11 + 1;
    }
  }
  while (ppSVar9 != ppSVar3) {
    (*((*ppSVar9)->super_GCObject)._vptr_GCObject[2])(*ppSVar9,v);
    ppSVar9 = ppSVar9 + 1;
    if (ppSVar9 == ppSVar6) {
      ppSVar6 = pppSVar12[1] + 0x40;
      ppSVar9 = pppSVar12[1];
      pppSVar12 = pppSVar12 + 1;
    }
  }
  return;
}

Assistant:

void MinorRoot(luna::GCObjectVisitor *v)
{
    for (auto t : g_scopeTable)
        t->Accept(v);
    for (auto c : g_scopeClosure)
        c->Accept(v);
    for (auto s : g_scopeString)
        s->Accept(v);
}